

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadBootStrap(CrateReader *this)

{
  long lVar1;
  bool bVar2;
  ssize_t sVar3;
  ostream *poVar4;
  uint64_t uVar5;
  uchar *in_R9;
  string local_dc0;
  __cxx11 local_da0 [32];
  string local_d80;
  string local_d60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d20 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d00 [32];
  ostringstream local_ce0 [8];
  ostringstream ss_e_6;
  string local_b68;
  ostringstream local_b48 [8];
  ostringstream ss_e_5;
  string local_9d0;
  allocator local_9a9;
  string local_9a8 [32];
  string local_988;
  ostringstream local_968 [8];
  ostringstream ss_e_4;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0 [32];
  ostringstream local_6d0 [8];
  ostringstream ss_e_3;
  string local_558;
  ostringstream local_538 [8];
  ostringstream ss_e_2;
  byte local_3c0;
  byte local_3bf;
  byte local_3be;
  uint8_t version [8];
  allocator<char> local_391;
  string local_390 [32];
  string local_370 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350 [32];
  ostringstream local_330 [8];
  ostringstream ss_e_1;
  string local_1b8;
  ostringstream local_198 [8];
  ostringstream ss_e;
  long local_20;
  uint8_t magic [8];
  CrateReader *this_local;
  
  magic = (uint8_t  [8])this;
  sVar3 = StreamReader::read(this->_sr,8,(void *)0x8,(size_t)&local_20);
  if (sVar3 == 8) {
    if (local_20 == 0x434453552d525850) {
      sVar3 = StreamReader::read(this->_sr,8,(void *)0x8,(size_t)&local_3c0);
      if (sVar3 == 8) {
        this->_version[0] = local_3c0;
        this->_version[1] = local_3bf;
        this->_version[2] = local_3be;
        if ((local_3c0 == 0) && (local_3bf < 4)) {
          ::std::__cxx11::ostringstream::ostringstream(local_6d0);
          poVar4 = ::std::operator<<((ostream *)local_6d0,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1851);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::to_string(&local_790,(uint)local_3c0);
          ::std::operator+((char *)local_770,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Version must be 0.4.0 or later, but got ");
          ::std::operator+(local_750,(char *)local_770);
          ::std::__cxx11::to_string(&local_7b0,(uint)local_3bf);
          ::std::operator+(local_730,local_750);
          ::std::operator+(local_710,(char *)local_730);
          ::std::__cxx11::to_string(&local_7d0,(uint)local_3be);
          ::std::operator+(local_6f0,local_710);
          poVar4 = ::std::operator<<((ostream *)local_6d0,(string *)local_6f0);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::~string((string *)local_6f0);
          ::std::__cxx11::string::~string((string *)&local_7d0);
          ::std::__cxx11::string::~string((string *)local_710);
          ::std::__cxx11::string::~string((string *)local_730);
          ::std::__cxx11::string::~string((string *)&local_7b0);
          ::std::__cxx11::string::~string((string *)local_750);
          ::std::__cxx11::string::~string(local_770);
          ::std::__cxx11::string::~string((string *)&local_790);
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_7f0);
          ::std::__cxx11::string::~string((string *)&local_7f0);
          ::std::__cxx11::ostringstream::~ostringstream(local_6d0);
        }
        else if ((local_3c0 == 0) && (local_3bf < 10)) {
          this->_toc_offset = 0;
          bVar2 = StreamReader::read8(this->_sr,&this->_toc_offset);
          if (bVar2) {
            if ((0x58 < this->_toc_offset) &&
               (lVar1 = this->_toc_offset, uVar5 = StreamReader::size(this->_sr),
               lVar1 < (long)uVar5)) {
              return true;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_ce0);
            poVar4 = ::std::operator<<((ostream *)local_ce0,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1865);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::to_string(&local_d80,this->_toc_offset);
            ::std::operator+((char *)local_d60,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Invalid TOC offset value: ");
            ::std::operator+(local_d40,(char *)local_d60);
            uVar5 = StreamReader::size(this->_sr);
            std::__cxx11::to_string(local_da0,uVar5);
            ::std::operator+(local_d20,local_d40);
            ::std::operator+(local_d00,(char *)local_d20);
            poVar4 = ::std::operator<<((ostream *)local_ce0,(string *)local_d00);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::~string((string *)local_d00);
            ::std::__cxx11::string::~string((string *)local_d20);
            ::std::__cxx11::string::~string((string *)local_da0);
            ::std::__cxx11::string::~string((string *)local_d40);
            ::std::__cxx11::string::~string(local_d60);
            ::std::__cxx11::string::~string((string *)&local_d80);
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_dc0);
            ::std::__cxx11::string::~string((string *)&local_dc0);
            ::std::__cxx11::ostringstream::~ostringstream(local_ce0);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_b48);
            poVar4 = ::std::operator<<((ostream *)local_b48,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x185f);
            ::std::operator<<(poVar4," ");
            poVar4 = ::std::operator<<((ostream *)local_b48,"Failed to read TOC offset.");
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_b68);
            ::std::__cxx11::string::~string((string *)&local_b68);
            ::std::__cxx11::ostringstream::~ostringstream(local_b48);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_968);
          poVar4 = ::std::operator<<((ostream *)local_968,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,"[Crate]");
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x185a);
          ::std::operator<<(poVar4," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_9a8,"Unsupported version {}.{}.{}. TinyUSDZ supports version up to 0.9.0"
                     ,&local_9a9);
          fmt::format<unsigned_char,unsigned_char,unsigned_char>
                    (&local_988,(fmt *)local_9a8,(string *)this,this->_version + 1,
                     this->_version + 2,in_R9);
          poVar4 = ::std::operator<<((ostream *)local_968,(string *)&local_988);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::~string((string *)&local_988);
          ::std::__cxx11::string::~string(local_9a8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_9d0);
          ::std::__cxx11::string::~string((string *)&local_9d0);
          ::std::__cxx11::ostringstream::~ostringstream(local_968);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_538);
        poVar4 = ::std::operator<<((ostream *)local_538,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1842);
        ::std::operator<<(poVar4," ");
        poVar4 = ::std::operator<<((ostream *)local_538,"Failed to read magic number.");
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_558);
        ::std::__cxx11::string::~string((string *)&local_558);
        ::std::__cxx11::ostringstream::~ostringstream(local_538);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_330);
      poVar4 = ::std::operator<<((ostream *)local_330,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x183b);
      ::std::operator<<(poVar4," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<unsigned_char*,void>
                (local_390,(uchar *)&local_20,magic,&local_391);
      ::std::operator+((char *)local_370,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Invalid magic number. Expected \'PXR-USDC\' but got \'");
      ::std::operator+(local_350,(char *)local_370);
      poVar4 = ::std::operator<<((ostream *)local_330,(string *)local_350);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::~string((string *)local_350);
      ::std::__cxx11::string::~string(local_370);
      ::std::__cxx11::string::~string(local_390);
      ::std::allocator<char>::~allocator(&local_391);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)version);
      ::std::__cxx11::string::~string((string *)version);
      ::std::__cxx11::ostringstream::~ostringstream(local_330);
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    poVar4 = ::std::operator<<((ostream *)local_198,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadBootStrap");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1835);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_198,"Failed to read magic number.");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1b8);
    ::std::__cxx11::string::~string((string *)&local_1b8);
    ::std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return false;
}

Assistant:

bool CrateReader::ReadBootStrap() {
  // parse header.
  uint8_t magic[8];
  if (8 != _sr->read(/* req */ 8, /* dst len */ 8, magic)) {
    PUSH_ERROR("Failed to read magic number.");
    return false;
  }

  if (memcmp(magic, "PXR-USDC", 8)) {
    PUSH_ERROR("Invalid magic number. Expected 'PXR-USDC' but got '" +
               std::string(magic, magic + 8) + "'");
    return false;
  }

  // parse version(first 3 bytes from 8 bytes)
  uint8_t version[8];
  if (8 != _sr->read(8, 8, version)) {
    PUSH_ERROR("Failed to read magic number.");
    return false;
  }

  DCOUT("version = " << int(version[0]) << "." << int(version[1]) << "."
                     << int(version[2]));

  _version[0] = version[0];
  _version[1] = version[1];
  _version[2] = version[2];

  // We only support version 0.4.0 or later.
  if ((version[0] == 0) && (version[1] < 4)) {
    PUSH_ERROR("Version must be 0.4.0 or later, but got " +
               std::to_string(version[0]) + "." + std::to_string(version[1]) +
               "." + std::to_string(version[2]));
    return false;
  }

  // Currently up to 0.9.0
  if ((version[0] == 0) && (version[1] < 10)) {
    // ok
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Unsupported version {}.{}.{}. TinyUSDZ supports version up to 0.9.0",
      _version[0], _version[1], _version[2]));
  }

  _toc_offset = 0;
  if (!_sr->read8(&_toc_offset)) {
    PUSH_ERROR("Failed to read TOC offset.");
    return false;
  }

  if ((_toc_offset <= 88) || (_toc_offset >= int64_t(_sr->size()))) {
    PUSH_ERROR("Invalid TOC offset value: " + std::to_string(_toc_offset) +
               ", filesize = " + std::to_string(_sr->size()) + ".");
    return false;
  }

  DCOUT("toc offset = " << _toc_offset);

  return true;
}